

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakeevaluator.cpp
# Opt level: O2

VisitReturn __thiscall
QMakeEvaluator::visitProLoop(QMakeEvaluator *this,ProKey *_variable,ushort *exprPtr,ushort *tokPtr)

{
  bool bVar1;
  VisitReturn VVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  ProString *pPVar6;
  QArrayDataPointer<ProString> *pQVar7;
  qsizetype qVar8;
  storage_type *psVar9;
  int i;
  int iVar10;
  char16_t *pcVar11;
  long lVar12;
  ulong uVar13;
  long in_FS_OFFSET;
  QStringView s;
  QByteArrayView QVar14;
  QByteArrayView QVar15;
  QArrayDataPointer<char16_t> local_178;
  bool ok;
  undefined1 auStack_15f [15];
  QArrayDataPointer<ProString> local_150;
  QArrayDataPointer<ProString> local_138;
  ProString val;
  ProString it_list;
  QArrayDataPointer<ProString> local_b8;
  QArrayDataPointer<ProString> local_98;
  ProKey variable;
  ushort *exprPtr_local;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  variable.super_ProString.m_file = -0x55555556;
  variable.super_ProString._36_4_ = 0xaaaaaaaa;
  variable.super_ProString.m_hash = 0xaaaaaaaaaaaaaaaa;
  variable.super_ProString.m_string.d.size = -0x5555555555555556;
  variable.super_ProString.m_offset = -0x55555556;
  variable.super_ProString.m_length = -0x55555556;
  variable.super_ProString.m_string.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  variable.super_ProString.m_string.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  exprPtr_local = exprPtr;
  ProString::ProString(&variable.super_ProString);
  local_98.d = (Data *)0x0;
  local_98.ptr = (ProString *)0x0;
  local_98.size = 0;
  local_b8.d = (Data *)0x0;
  local_b8.ptr = (ProString *)0x0;
  local_b8.size = 0;
  VVar2 = expandVariableReferences(this,&exprPtr_local,0,(ProStringList *)&local_b8,true);
  if (VVar2 == ReturnError) {
    VVar2 = ReturnError;
    goto LAB_001f8122;
  }
  it_list.m_file = -0x55555556;
  it_list._36_4_ = 0xaaaaaaaa;
  it_list.m_hash = 0xaaaaaaaaaaaaaaaa;
  it_list.m_string.d.size = -0x5555555555555556;
  it_list.m_offset = -0x55555556;
  it_list.m_length = -0x55555556;
  it_list.m_string.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  it_list.m_string.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  ProString::ProString(&it_list,local_b8.ptr);
  if ((_variable->super_ProString).m_length == 0) {
    bVar1 = ProString::operator!=(&it_list,(QString *)(QMakeInternal::statics + 0x108));
    if (!bVar1) {
      ProString::ProString(&val,(QString *)(QMakeInternal::statics + 0x120));
      ProString::operator=(&it_list,&val);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&val);
      goto LAB_001f7d0a;
    }
    psVar9 = (storage_type *)QByteArrayView::lengthHelperCharArray("Invalid loop expression.",0x19);
    QVar14.m_data = psVar9;
    QVar14.m_size = (qsizetype)&val;
    QString::fromLatin1(QVar14);
    evalError(this,&val.m_string);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&val);
    VVar2 = ReturnFalse;
  }
  else {
    pPVar6 = &map(this,_variable)->super_ProString;
    ProString::operator=(&variable.super_ProString,pPVar6);
    values((ProStringList *)&val,this,(ProKey *)&variable.super_ProString);
    QArrayDataPointer<ProString>::operator=(&local_98,(QArrayDataPointer<ProString> *)&val);
    QArrayDataPointer<ProString>::~QArrayDataPointer((QArrayDataPointer<ProString> *)&val);
LAB_001f7d0a:
    local_138.size = -0x5555555555555556;
    local_138.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_138.ptr = (ProString *)0xaaaaaaaaaaaaaaaa;
    values((ProStringList *)&local_138,this,(ProKey *)&it_list);
    if (local_138.size == 0) {
      bVar1 = ProString::operator==(&it_list,(QString *)(QMakeInternal::statics + 0x120));
      if (!bVar1) {
        val.m_string.d.ptr = it_list.m_string.d.ptr;
        val.m_string.d.d = (Data *)it_list.m_string.d.size;
        local_178._0_16_ =
             QStringView::mid((QStringView *)&val,(long)it_list.m_offset,(long)it_list.m_length);
        s.m_data = (storage_type_conflict *)QMakeInternal::statics._248_8_;
        s.m_size = QMakeInternal::statics._256_8_;
        qVar8 = QStringView::indexOf((QStringView *)&local_178,s,0,CaseSensitive);
        iVar3 = (int)qVar8;
        if (iVar3 != -1) {
          ok = true;
          val.m_string.d.d = (Data *)(long)iVar3;
          if (local_178.d < (Data *)(long)iVar3) {
            val.m_string.d.d = local_178.d;
          }
          val.m_string.d.ptr = local_178.ptr;
          iVar3 = QStringView::toInt((QStringView *)&val,&ok,10);
          if (ok == true) {
            val.m_string.d._0_16_ =
                 QStringView::mid((QStringView *)&local_178,(qVar8 << 0x20) + 0x200000000 >> 0x20,-1
                                 );
            iVar4 = QStringView::toInt((QStringView *)&val,&ok,10);
            if (ok == true) {
              iVar5 = iVar4 - iVar3;
              iVar10 = -iVar5;
              if (0 < iVar5) {
                iVar10 = iVar5;
              }
              QList<ProString>::reserve((QList<ProString> *)&local_138,(ulong)(iVar10 + 1));
              iVar10 = (int)(QArrayDataPointer<char16_t> *)&local_150;
              if (iVar3 < iVar4) {
                for (; iVar3 <= iVar4; iVar3 = iVar3 + 1) {
                  QString::number(iVar10,iVar3);
                  ProString::ProString(&val,(QString *)&local_150);
                  QList<ProString>::emplaceBack<ProString_const&>
                            ((QList<ProString> *)&local_138,&val);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                            ((QArrayDataPointer<char16_t> *)&val);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                            ((QArrayDataPointer<char16_t> *)&local_150);
                }
              }
              else {
                for (; iVar4 <= iVar3; iVar3 = iVar3 + -1) {
                  QString::number(iVar10,iVar3);
                  ProString::ProString(&val,(QString *)&local_150);
                  QList<ProString>::emplaceBack<ProString_const&>
                            ((QList<ProString> *)&local_138,&val);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                            ((QArrayDataPointer<char16_t> *)&val);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                            ((QArrayDataPointer<char16_t> *)&local_150);
                }
              }
            }
          }
        }
        goto LAB_001f7d4b;
      }
      bVar1 = true;
      if (this->m_debugLevel != 0) {
        val.m_string.d.ptr = variable.super_ProString.m_string.d.ptr;
        val.m_string.d.d = (Data *)variable.super_ProString.m_string.d.size;
        local_150._0_16_ =
             QStringView::mid((QStringView *)&val,(long)variable.super_ProString.m_offset,
                              (long)variable.super_ProString.m_length);
        QStringView::toLocal8Bit((QByteArray *)&val,(QStringView *)&local_150);
        pcVar11 = val.m_string.d.ptr;
        if (val.m_string.d.ptr == (char16_t *)0x0) {
          pcVar11 = (char16_t *)&QByteArray::_empty;
        }
        traceMsgInternal(this,"entering infinite loop for %s",pcVar11);
        goto LAB_001f7e1a;
      }
    }
    else {
LAB_001f7d4b:
      if (this->m_debugLevel == 0) {
        bVar1 = false;
      }
      else {
        val.m_string.d.ptr = variable.super_ProString.m_string.d.ptr;
        val.m_string.d.d = (Data *)variable.super_ProString.m_string.d.size;
        _ok = QStringView::mid((QStringView *)&val,(long)variable.super_ProString.m_offset,
                               (long)variable.super_ProString.m_length);
        QStringView::toLocal8Bit((QByteArray *)&val,(QStringView *)&ok);
        pcVar11 = val.m_string.d.ptr;
        if (val.m_string.d.ptr == (char16_t *)0x0) {
          pcVar11 = (char16_t *)&QByteArray::_empty;
        }
        bVar1 = false;
        formatValueList((QString *)&local_178,(ProStringList *)&local_138,false);
        QString::toLocal8Bit((QByteArray *)&local_150,(QString *)&local_178);
        pPVar6 = local_150.ptr;
        if (local_150.ptr == (ProString *)0x0) {
          pPVar6 = (ProString *)&QByteArray::_empty;
        }
        traceMsgInternal(this,"entering loop for %s over %s",pcVar11,pPVar6);
        QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_150);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_178);
LAB_001f7e1a:
        QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&val);
      }
    }
    VVar2 = ReturnTrue;
    uVar13 = 0;
LAB_001f7ed9:
    do {
      iVar3 = (int)uVar13;
      if (bVar1) {
        if (variable.super_ProString.m_length != 0) {
          QString::number((int)(QStringView *)&local_178,iVar3);
          ProString::ProString(&val,(QString *)&local_178);
          ProStringList::ProStringList((ProStringList *)&local_150,&val);
          pQVar7 = (QArrayDataPointer<ProString> *)
                   QMap<ProKey,_ProStringList>::operator[]
                             ((QMap<ProKey,_ProStringList> *)
                              ((this->m_valuemapStack).
                               super_list<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
                               .
                               super__List_base<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
                               ._M_impl._M_node.super__List_node_base._M_prev + 1),&variable);
          QArrayDataPointer<ProString>::operator=(pQVar7,&local_150);
          QArrayDataPointer<ProString>::~QArrayDataPointer(&local_150);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&val);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_178);
        }
        if (999 < iVar3) {
          psVar9 = (storage_type *)
                   QByteArrayView::lengthHelperCharArray
                             ("Ran into infinite loop (> 1000 iterations).",0x2c);
          QVar15.m_data = psVar9;
          QVar15.m_size = (qsizetype)&val;
          QString::fromLatin1(QVar15);
          evalError(this,&val.m_string);
LAB_001f80bd:
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&val);
          goto LAB_001f80c2;
        }
        uVar13 = (ulong)(iVar3 + 1);
        if (this->m_debugLevel != 0) {
          traceMsgInternal(this,"loop iteration %d",uVar13);
        }
      }
      else {
        val.m_file = -0x55555556;
        val._36_4_ = 0xaaaaaaaa;
        val.m_hash._0_4_ = 0xaaaaaaaa;
        val.m_hash._4_4_ = 0xaaaaaaaa;
        val.m_string.d.size._0_4_ = 0xaaaaaaaa;
        val.m_string.d.size._4_4_ = 0xaaaaaaaa;
        val.m_offset = -0x55555556;
        val.m_length = -0x55555556;
        val.m_string.d.ptr._0_4_ = 0xaaaaaaaa;
        val.m_string.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
        val.m_string.d.ptr._4_4_ = 0xaaaaaaaa;
        ProString::ProString(&val);
        uVar13 = (ulong)iVar3;
        lVar12 = uVar13 * 0x30;
        do {
          if (local_138.size <= (long)uVar13) goto LAB_001f80bd;
          uVar13 = uVar13 + 1;
          ProString::operator=(&val,(ProString *)((long)&((local_138.ptr)->m_string).d.d + lVar12));
          lVar12 = lVar12 + 0x30;
        } while (val.m_length == 0);
        if (this->m_debugLevel != 0) {
          formatValue((QString *)&local_178,&val,true);
          QString::toLocal8Bit((QByteArray *)&local_150,(QString *)&local_178);
          pPVar6 = local_150.ptr;
          if (local_150.ptr == (ProString *)0x0) {
            pPVar6 = (ProString *)&QByteArray::_empty;
          }
          traceMsgInternal(this,"loop iteration %s",pPVar6);
          QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_150);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_178);
        }
        ProStringList::ProStringList((ProStringList *)&local_150,&val);
        pQVar7 = (QArrayDataPointer<ProString> *)
                 QMap<ProKey,_ProStringList>::operator[]
                           ((QMap<ProKey,_ProStringList> *)
                            ((this->m_valuemapStack).
                             super_list<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
                             .
                             super__List_base<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
                             ._M_impl._M_node.super__List_node_base._M_prev + 1),&variable);
        QArrayDataPointer<ProString>::operator=(pQVar7,&local_150);
        QArrayDataPointer<ProString>::~QArrayDataPointer(&local_150);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&val);
      }
      VVar2 = visitProBlock(this,tokPtr);
    } while (VVar2 < ReturnError);
    if (VVar2 == ReturnNext) {
      VVar2 = ReturnTrue;
      goto LAB_001f7ed9;
    }
    if (VVar2 == ReturnBreak) {
      VVar2 = ReturnTrue;
    }
LAB_001f80c2:
    if (this->m_debugLevel != 0) {
      traceMsgInternal(this,"done looping");
    }
    if (variable.super_ProString.m_length != 0) {
      pQVar7 = (QArrayDataPointer<ProString> *)
               QMap<ProKey,_ProStringList>::operator[]
                         ((QMap<ProKey,_ProStringList> *)
                          ((this->m_valuemapStack).
                           super_list<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
                           .
                           super__List_base<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
                           ._M_impl._M_node.super__List_node_base._M_prev + 1),&variable);
      QArrayDataPointer<ProString>::operator=(pQVar7,&local_98);
    }
    QArrayDataPointer<ProString>::~QArrayDataPointer(&local_138);
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&it_list);
LAB_001f8122:
  QArrayDataPointer<ProString>::~QArrayDataPointer(&local_b8);
  QArrayDataPointer<ProString>::~QArrayDataPointer(&local_98);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&variable);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return VVar2;
}

Assistant:

QMakeEvaluator::VisitReturn QMakeEvaluator::visitProLoop(
        const ProKey &_variable, const ushort *exprPtr, const ushort *tokPtr)
{
    VisitReturn ret = ReturnTrue;
    bool infinite = false;
    int index = 0;
    ProKey variable;
    ProStringList oldVarVal;
    ProStringList it_list_out;
    if (expandVariableReferences(exprPtr, 0, &it_list_out, true) == ReturnError)
        return ReturnError;
    ProString it_list = it_list_out.at(0);
    if (_variable.isEmpty()) {
        if (it_list != statics.strever) {
            evalError(fL1S("Invalid loop expression."));
            return ReturnFalse;
        }
        it_list = ProString(statics.strforever);
    } else {
        variable = map(_variable);
        oldVarVal = values(variable);
    }
    ProStringList list = values(it_list.toKey());
    if (list.isEmpty()) {
        if (it_list == statics.strforever) {
            if (m_cumulative) {
                // The termination conditions wouldn't be evaluated, so we must skip it.
                traceMsg("skipping forever loop in cumulative mode");
                return ReturnFalse;
            }
            infinite = true;
        } else {
            QStringView itl = it_list.toQStringView();
            int dotdot = itl.indexOf(statics.strDotDot);
            if (dotdot != -1) {
                bool ok;
                int start = itl.left(dotdot).toInt(&ok);
                if (ok) {
                    int end = itl.mid(dotdot+2).toInt(&ok);
                    if (ok) {
                        const int absDiff = qAbs(end - start);
                        if (m_cumulative && absDiff > 100) {
                            // Such a loop is unlikely to contribute something useful to the
                            // file collection, and may cause considerable delay.
                            traceMsg("skipping excessive loop in cumulative mode");
                            return ReturnFalse;
                        }
                        list.reserve(absDiff + 1);
                        if (start < end) {
                            for (int i = start; i <= end; i++)
                                list << ProString(QString::number(i));
                        } else {
                            for (int i = start; i >= end; i--)
                                list << ProString(QString::number(i));
                        }
                    }
                }
            }
        }
    }

    if (infinite)
        traceMsg("entering infinite loop for %s", dbgKey(variable));
    else
        traceMsg("entering loop for %s over %s", dbgKey(variable), dbgStrList(list));

    forever {
        if (infinite) {
            if (!variable.isEmpty())
                m_valuemapStack.top()[variable] = ProStringList(ProString(QString::number(index)));
            if (++index > 1000) {
                evalError(fL1S("Ran into infinite loop (> 1000 iterations)."));
                break;
            }
            traceMsg("loop iteration %d", index);
        } else {
            ProString val;
            do {
                if (index >= list.size())
                    goto do_break;
                val = list.at(index++);
            } while (val.isEmpty()); // stupid, but qmake is like that
            traceMsg("loop iteration %s", dbgStr(val));
            m_valuemapStack.top()[variable] = ProStringList(val);
        }

        ret = visitProBlock(tokPtr);
        switch (ret) {
        case ReturnTrue:
        case ReturnFalse:
            break;
        case ReturnNext:
            ret = ReturnTrue;
            break;
        case ReturnBreak:
            ret = ReturnTrue;
            goto do_break;
        default:
            goto do_break;
        }
    }